

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_point *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  size_type *psVar1;
  Property *prop;
  _Rb_tree_header *p_Var2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  size_type sVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  ulong uVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  ostream *poVar15;
  long *plVar16;
  long *plVar17;
  const_iterator cVar18;
  mapped_type *pmVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  _Base_ptr p_Var21;
  Property *args;
  size_type __n;
  ulong __n_00;
  size_t __n_01;
  undefined1 uVar22;
  size_t i;
  ulong uVar23;
  string *__v;
  pointer pcVar24;
  _Alloc_hider _Var25;
  Property *prop_00;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *args_2;
  long lVar26;
  undefined8 uVar27;
  _Base_ptr p_Var28;
  anon_struct_8_0_00000001_for___align aVar29;
  byte bVar30;
  bool bVar31;
  bool bVar32;
  ParseResult ret;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::value::point3f> pv;
  Animatable<tinyusdz::value::point3f> dst;
  optional<tinyusdz::Animatable<tinyusdz::value::point3f>_> av;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 local_628 [8];
  _Alloc_hider local_620;
  undefined1 local_618 [8];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [24];
  string local_5d8;
  _Base_ptr local_5b8;
  key_type local_5b0;
  UsdPrimvarReader_point *local_590;
  _Base_ptr local_588;
  AttrMetas *local_580;
  AttrMetas *local_578;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *local_570;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  optional<tinyusdz::value::point3f> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  undefined4 *local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined2 uStack_4f4;
  undefined1 uStack_4f2;
  undefined1 uStack_4f1;
  undefined1 local_4e8 [8];
  undefined4 local_4e0;
  char acStack_4dc [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  undefined1 local_4c0;
  ios_base local_478 [280];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_360;
  undefined1 local_358 [32];
  ulong local_338;
  undefined1 local_330 [32];
  string local_310 [16];
  long local_300 [2];
  string local_2f0;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [12];
  storage_t<unsigned_int> sStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [40];
  storage_union sStack_268;
  undefined1 local_258 [40];
  ios_base aiStack_230 [8];
  bool local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [32];
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [2];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [40];
  undefined1 auStack_120 [40];
  undefined1 auStack_f8 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  undefined1 local_a0 [32];
  undefined1 local_80 [16];
  storage_t<tinyusdz::Token> local_70;
  storage_t<tinyusdz::Token> sStack_50;
  
  local_568._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_568._M_impl.super__Rb_tree_header._M_header;
  local_568._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_568._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_568._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop_00 = (Property *)warn;
  args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)err;
  local_590 = preader;
  local_568._M_impl.super__Rb_tree_header._M_header._M_right =
       local_568._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT17(local_2a0._M_local_buf[7],
                             CONCAT16(local_2a0._M_local_buf[6],
                                      CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                               CONCAT13(local_2a0._M_local_buf[3],
                                                        CONCAT12(local_2a0._M_local_buf[2],
                                                                 local_2a0._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  p_Var21 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_358._16_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar30 = p_Var21 == (_Base_ptr)local_358._16_8_;
  if (!(bool)bVar30) {
    local_580 = &(local_590->fallback)._metas;
    local_358._8_8_ = &(local_590->fallback)._paths;
    local_478._272_8_ = &(local_590->fallback)._attrib;
    local_570 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_590->varname;
    local_578 = &(local_590->result)._metas;
    local_478._264_8_ = &(local_590->result)._actual_type_name;
    local_360 = &(local_590->super_ShaderNode).super_UsdShadePrim.props;
    local_5b8 = p_Var21;
    local_358._0_8_ = warn;
    do {
      p_Var21 = local_5b8;
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_528,*(long *)(local_5b8 + 1),
                 (long)&(local_5b8[1]._M_parent)->_M_color + *(long *)(local_5b8 + 1));
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"inputs:fallback","");
      sVar7 = local_528._M_string_length;
      sVar6 = local_5d8._M_string_length;
      local_620._M_p = auStack_610;
      local_618 = (undefined1  [8])0x0;
      auStack_610._0_8_ = auStack_610._0_8_ & 0xffffffffffffff00;
      __n = local_528._M_string_length;
      if (local_5d8._M_string_length < local_528._M_string_length) {
        __n = local_5d8._M_string_length;
      }
      if (__n == 0) {
        bVar31 = true;
      }
      else {
        iVar13 = bcmp(local_528._M_dataplus._M_p,local_5d8._M_dataplus._M_p,__n);
        bVar31 = iVar13 == 0;
      }
      prop = (Property *)(p_Var21 + 2);
      if ((bool)(bVar31 ^ 1U | sVar7 != sVar6)) {
        local_628._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var21[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_628._0_4_ = 7;
          local_4e8._0_4_ = SUB84(&local_4d8,0);
          local_4e8._4_2_ = (undefined2)((ulong)&local_4d8 >> 0x20);
          local_4e8._6_2_ = (undefined2)((ulong)&local_4d8 >> 0x30);
          local_600._0_8_ = &DAT_0000003e;
          pcVar14 = (char *)::std::__cxx11::string::_M_create((ulong *)local_4e8,(ulong)local_600);
          local_4e8._0_4_ = SUB84(pcVar14,0);
          local_4e8._4_2_ = (undefined2)((ulong)pcVar14 >> 0x20);
          local_4e8._6_2_ = (undefined2)((ulong)pcVar14 >> 0x30);
          local_4d8._M_allocated_capacity = local_600._0_8_;
          builtin_strncpy(pcVar14,"Property `{}` must be Attribute, but declared as Relationship.",
                          0x3e);
          local_4e0 = (undefined4)local_600._0_8_;
          acStack_4dc._0_2_ = SUB82(local_600._0_8_,4);
          acStack_4dc._2_2_ = SUB82(local_600._0_8_,6);
          pcVar14[local_600._0_8_] = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4e8,&local_5d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_600._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_620,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0._M_local_buf[7],
                                     CONCAT16(local_2a0._M_local_buf[6],
                                              CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                       CONCAT13(local_2a0._M_local_buf[3],
                                                                CONCAT12(local_2a0._M_local_buf[2],
                                                                         local_2a0.
                                                                         _M_allocated_capacity._0_2_
                                                                        ))))) + 1);
          }
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
          if (paVar4 != &local_4d8) {
            operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
        }
        if (p_Var21[6]._M_left != p_Var21[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_358._8_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var21[6]._M_parent);
          local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_600,(Attribute *)prop);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity._4_2_ = 0x3374;
        local_2a0._M_local_buf[6] = 'f';
        local_2a0._M_allocated_capacity._0_2_ = 0x6f70;
        local_2a0._M_local_buf[2] = 'i';
        local_2a0._M_local_buf[3] = 'n';
        local_2b0._8_4_ = 7;
        sStack_2a4._0_2_ = 0;
        sStack_2a4._2_2_ = 0;
        local_2a0._M_local_buf[7] = '\0';
        if ((pointer)local_600._8_8_ == (pointer)0x7) {
          bVar31 = *(int *)(local_600._0_8_ + 3) == 0x6633746e &&
                   *(int *)local_600._0_8_ == 0x6e696f70;
        }
        else {
          bVar31 = false;
        }
        bVar32 = true;
        if (!bVar31) {
          local_508 = &local_4f8;
          uStack_4f4 = 0x3374;
          local_4f8 = 0x616f6c66;
          local_500 = 6;
          uStack_4f2 = 0;
          if ((pointer)local_600._8_8_ == (pointer)0x6) {
            bVar32 = *(short *)(local_600._0_8_ + 4) == 0x3374 &&
                     *(int *)local_600._0_8_ == 0x616f6c66;
          }
          else {
            bVar32 = false;
          }
        }
        if ((!bVar31) && (local_508 != &local_4f8)) {
          operator_delete(local_508,
                          CONCAT17(uStack_4f1,CONCAT16(uStack_4f2,CONCAT24(uStack_4f4,local_4f8))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT17(local_2a0._M_local_buf[7],
                                   CONCAT16(local_2a0._M_local_buf[6],
                                            CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                     CONCAT13(local_2a0._M_local_buf[3],
                                                              CONCAT12(local_2a0._M_local_buf[2],
                                                                       local_2a0.
                                                                       _M_allocated_capacity._0_2_))
                                                    ))) + 1);
        }
        if (bVar32) {
          iVar13 = *(int *)((long)&p_Var21[0x17]._M_parent + 4);
          if (iVar13 != 1) {
            if (iVar13 == 0) {
              (local_590->fallback)._value_empty = true;
              AttrMetas::operator=(local_580,(AttrMetas *)(p_Var21 + 7));
              __v = &local_5d8;
LAB_00255c1f:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_568,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
              local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
            }
            else {
              prop_00 = (Property *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_620,0,(char *)local_618,0x3f9856);
              local_628._0_4_ = 8;
            }
            goto LAB_00255c2c;
          }
          if (p_Var21[5]._M_left == p_Var21[5]._M_parent) {
            if (p_Var21[4]._M_right == (_Base_ptr)0x0) {
              bVar31 = false;
            }
            else {
              iVar13 = (**(code **)p_Var21[4]._M_right)();
              bVar31 = iVar13 == 4;
            }
            if ((bVar31) || ((p_Var21[5]._M_color & _S_black) != _S_red)) {
              (local_590->fallback)._blocked = true;
            }
          }
          if (((char)p_Var21[5]._M_color == _S_red) &&
             ((((p_Var21[4]._M_right != (_Base_ptr)0x0 &&
                (iVar13 = (**(code **)p_Var21[4]._M_right)(), iVar13 == 0)) ||
               ((p_Var21[4]._M_right != (_Base_ptr)0x0 &&
                (iVar13 = (**(code **)p_Var21[4]._M_right)(), iVar13 == 1)))) &&
              (p_Var21[5]._M_left == p_Var21[5]._M_parent)))) {
            bVar31 = true;
            bVar32 = false;
          }
          else {
            local_4c8 = Varying;
            uStack_4c7 = 0;
            local_4c0 = 0;
            local_4d8._M_allocated_capacity = 0;
            local_4d8._M_local_buf[8] = '\0';
            local_4d8._9_7_ = 0;
            local_4e0._0_1_ = '\0';
            local_4e0._1_1_ = '\0';
            local_4e0._2_1_ = '\0';
            local_4e0._3_1_ = '\0';
            acStack_4dc[0] = '\0';
            acStack_4dc[1] = '\0';
            local_4e8._0_4_ = 0;
            local_4e8._4_2_ = 0;
            local_4e8._6_2_ = 0;
            bVar31 = primvar::PrimVar::is_valid((PrimVar *)&p_Var21[4]._M_parent);
            if (bVar31) {
              if (((char)p_Var21[5]._M_color == _S_red) &&
                 (((p_Var21[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar13 = (**(code **)p_Var21[4]._M_right)(), iVar13 == 0)) ||
                  ((p_Var21[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar13 = (**(code **)p_Var21[4]._M_right)(), iVar13 == 1)))))) {
                cVar12 = '\0';
              }
              else {
                primvar::PrimVar::get_value<tinyusdz::value::point3f>
                          (&local_538,(PrimVar *)&p_Var21[4]._M_parent);
                cVar12 = local_538.has_value_;
                if (local_538.has_value_ == true) {
                  local_330._27_4_ = local_538.contained._8_4_;
                  local_330[0x13] = (undefined1)local_538.contained._0_8_;
                  local_330._20_7_ = (undefined7)((ulong)local_538.contained._0_8_ >> 8);
                  local_4e8._0_4_ = (undefined4)local_538.contained._0_8_;
                  local_4e8._4_2_ = (undefined2)((ulong)local_538.contained._0_8_ >> 0x20);
                  local_4e8._6_2_ = (undefined2)((ulong)local_538.contained._0_8_ >> 0x30);
                  local_4e0._0_1_ = local_538.contained._8_1_;
                  local_4e0._1_1_ = local_538.contained._9_1_;
                  local_4e0._2_1_ = local_538.contained._10_1_;
                  local_4e0._3_1_ = local_538.contained._11_1_;
                  acStack_4dc[0] = '\x01';
                  acStack_4dc[1] = '\0';
                }
              }
              if (p_Var21[5]._M_left == p_Var21[5]._M_parent) {
                if (cVar12 == '\0') goto LAB_002558a9;
              }
              else {
                p_Var28 = (_Base_ptr)&p_Var21[5]._M_parent;
                lVar26 = 0;
                uVar23 = 0;
                local_588 = p_Var28;
                do {
                  if ((char)p_Var21[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)p_Var28);
                  }
                  lVar3 = *(long *)p_Var28;
                  if (*(char *)(lVar3 + 0x20 + lVar26) == '\x01') {
                    TypedTimeSamples<tinyusdz::value::point3f>::add_blocked_sample
                              ((TypedTimeSamples<tinyusdz::value::point3f> *)&local_4d8,
                               *(double *)(lVar3 + lVar26));
                  }
                  else {
                    tinyusdz::value::Value::get_value<tinyusdz::value::point3f>
                              ((optional<tinyusdz::value::point3f> *)(local_330 + 0x10),
                               (Value *)(lVar26 + lVar3 + 8),false);
                    uVar22 = local_330[0x10];
                    local_538.has_value_ = (bool)local_330[0x10];
                    if (local_330[0x10] == '\x01') {
                      local_538.contained._8_4_ = CONCAT13(local_330[0x1f],local_330._28_3_);
                      local_538.contained._0_8_ = CONCAT17(local_330[0x1b],local_330._20_7_);
                      TypedTimeSamples<tinyusdz::value::point3f>::add_sample
                                ((TypedTimeSamples<tinyusdz::value::point3f> *)&local_4d8,
                                 *(double *)(lVar3 + lVar26),(point3f *)&local_538.contained);
                    }
                    else {
                      local_5b0._M_dataplus._M_p._7_1_ = 0;
                      local_5b0._M_string_length._0_5_ = 0;
                      local_5b0._M_string_length._5_2_ = 0;
                      local_5b0._M_string_length._7_1_ = '\0';
                      local_5b0.field_2._M_allocated_capacity._0_5_ = 0;
                      local_5b0.field_2._M_allocated_capacity._5_2_ = 0;
                    }
                    p_Var28 = local_588;
                    if (uVar22 == '\0') goto LAB_002558ac;
                  }
                  uVar23 = uVar23 + 1;
                  lVar26 = lVar26 + 0x28;
                  p_Var21 = local_5b8;
                } while (uVar23 < (ulong)(((long)local_5b8[5]._M_left - (long)local_5b8[5]._M_parent
                                          >> 3) * -0x3333333333333333));
              }
              uVar27 = local_4d8._M_allocated_capacity;
              local_5b0._M_string_length._7_1_ = (char)local_4e0;
              local_5b0.field_2._M_allocated_capacity._0_5_ =
                   (undefined5)
                   (CONCAT26(acStack_4dc._0_2_,CONCAT42(local_4e0,local_4e8._6_2_)) >> 0x18);
              local_5b0._M_dataplus._M_p._7_1_ = (undefined1)local_4e8._0_4_;
              local_5b0._M_string_length._0_5_ =
                   (undefined5)(CONCAT24(local_4e8._4_2_,local_4e8._0_4_) >> 8);
              local_5b0._M_string_length._5_2_ = local_4e8._6_2_;
              aVar29._1_7_ = local_4d8._9_7_;
              aVar29._0_1_ = local_4d8._M_local_buf[8];
              lVar26 = CONCAT71(uStack_4c7,local_4c8);
              local_4d8._M_allocated_capacity = 0;
              local_4d8._M_local_buf[8] = '\0';
              local_4d8._9_7_ = 0;
              local_4c8 = Varying;
              uStack_4c7 = 0;
              bVar31 = true;
              uVar22 = local_4c0;
            }
            else {
LAB_002558a9:
              local_5b0._M_dataplus._M_p._7_1_ = 0;
              local_5b0._M_string_length._0_5_ = 0;
              local_5b0._M_string_length._5_2_ = 0;
              local_5b0._M_string_length._7_1_ = '\0';
              local_5b0.field_2._M_allocated_capacity._0_5_ = 0;
              local_5b0.field_2._M_allocated_capacity._5_2_ = 0;
LAB_002558ac:
              uVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              aVar29 = (anon_struct_8_0_00000001_for___align)0x0;
              lVar26 = 0;
              uVar22 = 0;
              bVar31 = false;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4d8._M_allocated_capacity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete((void *)local_4d8._M_allocated_capacity,
                              CONCAT71(uStack_4c7,local_4c8) - local_4d8._0_8_);
            }
            local_2b0[0] = (ostringstream)bVar31;
            if (bVar31 != false) {
              local_2a0._M_allocated_capacity._0_2_ =
                   (undefined2)
                   (CONCAT53(local_5b0.field_2._M_allocated_capacity._0_5_,
                             CONCAT12(local_5b0._M_string_length._7_1_,
                                      local_5b0._M_string_length._5_2_)) >> 0x10);
              local_2a0._M_local_buf[2] = (char)((uint5)local_5b0.field_2._0_5_ >> 8);
              local_2a0._M_local_buf[3] = (char)((uint5)local_5b0.field_2._0_5_ >> 0x10);
              local_2a0._M_allocated_capacity._4_2_ =
                   (undefined2)((uint5)local_5b0.field_2._0_5_ >> 0x18);
              local_2b0._8_4_ =
                   (undefined4)
                   CONCAT51((undefined5)local_5b0._M_string_length,local_5b0._M_dataplus._M_p._7_1_)
              ;
              sStack_2a4._0_2_ = (undefined2)((uint5)(undefined5)local_5b0._M_string_length >> 0x18)
              ;
              sStack_2a4._2_2_ = local_5b0._M_string_length._5_2_;
              local_290[0x10] = uVar22;
              local_2a0._8_8_ = uVar27;
              local_290._0_8_ = aVar29;
              local_290._8_8_ = lVar26;
            }
            if (bVar31 == true) {
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::point3f>>::
              operator=((optional<tinyusdz::Animatable<tinyusdz::value::point3f>> *)
                        local_478._272_8_,(Animatable<tinyusdz::value::point3f> *)(local_2b0 + 8));
            }
            else {
              local_628._0_4_ = 8;
              prop_00 = (Property *)0x55;
              ::std::__cxx11::string::_M_replace((ulong)&local_620,0,(char *)local_618,0x3f9b24);
            }
            p_Var21 = local_5b8;
            if ((local_2b0[0] == (ostringstream)0x1) &&
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              operator_delete((void *)local_2a0._8_8_,local_290._8_8_ - local_2a0._8_8_);
            }
            if (bVar31 != false) {
              AttrMetas::operator=(local_580,(AttrMetas *)(p_Var21 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_568,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_5d8);
              local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
            }
            bVar32 = true;
            bVar31 = false;
          }
          if (bVar31) {
            if (p_Var21[6]._M_left != p_Var21[6]._M_parent) {
              AttrMetas::operator=(local_580,(AttrMetas *)(p_Var21 + 7));
              __v = (string *)&local_528;
              goto LAB_00255c1f;
            }
            goto LAB_00255c2c;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
            operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
          }
          if ((bVar32) ||
             (pcVar24 = (pointer)auStack_610._0_8_, _Var25._M_p = local_620._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610))
          goto LAB_00255c43;
        }
        else {
          local_628._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_5d8._M_dataplus._M_p,
                               local_5d8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," expects type `",0xf);
          local_4e8._0_4_ = SUB84(&local_4d8,0);
          local_4e8._4_2_ = (undefined2)((ulong)&local_4d8 >> 0x20);
          local_4e8._6_2_ = (undefined2)((ulong)&local_4d8 >> 0x30);
          local_4d8._M_allocated_capacity = 0x6633746e696f70;
          local_4e0._0_1_ = '\a';
          local_4e0._1_1_ = '\0';
          local_4e0._2_1_ = '\0';
          local_4e0._3_1_ = '\0';
          acStack_4dc[0] = '\0';
          acStack_4dc[1] = '\0';
          acStack_4dc[2] = '\0';
          acStack_4dc[3] = '\0';
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_4d8._M_local_buf,7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"` but defined as type `",0x17);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_600._0_8_,local_600._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"`",1);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
          if (paVar4 != &local_4d8) {
            operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_620,(string *)local_4e8);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
          if (paVar4 != &local_4d8) {
            operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
LAB_00255c2c:
          pcVar24 = (pointer)local_5f0._0_8_;
          _Var25._M_p = (pointer)local_600._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0)
          goto LAB_00255c43;
        }
        operator_delete(_Var25._M_p,(ulong)(pcVar24 + 1));
      }
LAB_00255c43:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
      }
      iVar13 = 0;
      if (((ulong)local_628 & 0xfffffffd) == 0) {
        iVar13 = 3;
LAB_00255ec4:
        bVar31 = false;
      }
      else {
        bVar31 = true;
        if (local_628._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x11d2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
          local_600._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_600,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4e8,(fmt *)local_600,(string *)"inputs:fallback",
                     (char (*) [16])&local_620,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_4e8._6_2_,
                                                CONCAT24(local_4e8._4_2_,local_4e8._0_4_)),
                               CONCAT26(acStack_4dc._2_2_,CONCAT24(acStack_4dc._0_2_,local_4e0)));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
          if (paVar4 != &local_4d8) {
            operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
            operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar16 = (long *)::std::__cxx11::string::_M_append
                                        (local_600,(ulong)(err->_M_dataplus)._M_p);
            local_4e8._0_4_ = SUB84(&local_4d8,0);
            local_4e8._4_2_ = (undefined2)((ulong)&local_4d8 >> 0x20);
            local_4e8._6_2_ = (undefined2)((ulong)&local_4d8 >> 0x30);
            lVar26 = *plVar16;
            plVar17 = plVar16 + 2;
            if ((long *)lVar26 == plVar17) {
              local_4d8._M_allocated_capacity = *plVar17;
              local_4d8._M_local_buf[8] = (char)plVar16[3];
              local_4d8._9_7_ = (undefined7)((ulong)plVar16[3] >> 8);
            }
            else {
              local_4e8._0_4_ = (undefined4)lVar26;
              local_4e8._4_2_ = (undefined2)((ulong)lVar26 >> 0x20);
              local_4e8._6_2_ = (undefined2)((ulong)lVar26 >> 0x30);
              local_4d8._M_allocated_capacity = *plVar17;
            }
            lVar26 = plVar16[1];
            local_4e0 = (undefined4)lVar26;
            acStack_4dc._0_2_ = (undefined2)((ulong)lVar26 >> 0x20);
            acStack_4dc._2_2_ = (undefined2)((ulong)lVar26 >> 0x30);
            *plVar16 = (long)plVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_4e8);
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
            if (paVar4 != &local_4d8) {
              operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
              operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          iVar13 = 1;
          goto LAB_00255ec4;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610) {
        operator_delete(local_620._M_p,(ulong)(auStack_610._0_8_ + 1));
      }
      if (bVar31) {
        local_588 = local_5b8 + 1;
        iVar13 = ::std::__cxx11::string::compare((char *)local_588);
        if (iVar13 == 0) {
          local_2d0._0_8_ = (long)local_2d0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"inputs:varname","")
          ;
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_568,(key_type *)local_2d0);
          bVar31 = (_Rb_tree_header *)cVar18._M_node == &local_568._M_impl.super__Rb_tree_header;
          if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
            operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
          }
        }
        else {
          bVar31 = false;
        }
        p_Var21 = local_5b8;
        if (bVar31) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
          sStack_2a4._0_2_ = 0;
          sStack_2a4._2_2_ = 0;
          local_2a0._M_allocated_capacity._0_2_ = 0;
          local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
          local_220._M_allocated_capacity = 0;
          local_220._M_local_buf[8] = '\0';
          auStack_120._32_8_ = 0;
          auStack_f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_120._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_120._24_8_ = 0;
          auStack_f8._16_4_ = 0;
          auStack_f8._24_8_ = 0;
          sStack_268._8_1_ = false;
          local_290._32_8_ = (_Base_ptr)0x0;
          sStack_268.dynamic = (_Base_ptr)0x0;
          local_290._16_8_ = 0;
          local_290._24_8_ = (_Base_ptr)0x0;
          local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._8_8_ = 0;
          local_228 = false;
          local_258._32_8_ = 0;
          aiStack_230 = (ios_base  [8])0x0;
          local_258._16_8_ = (pointer)0x0;
          local_258._24_4_ = ResetToExplicit;
          local_258._28_4_ = EmptyAttrib;
          local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_258._8_8_ = (pointer)0x0;
          local_1f0[0] = false;
          local_210._16_8_ = 0;
          local_210._24_8_ = 0;
          local_210._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = 0;
          aaStack_1e0[1]._8_1_ = false;
          aaStack_1e0[0]._8_8_ = 0;
          aaStack_1e0[1]._0_8_ = (pointer)0x0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aaStack_1e0[0]._M_allocated_capacity = 0;
          local_1a0[0] = '\0';
          local_1c0._16_8_ = (pointer)0x0;
          local_1c0._24_8_ = 0;
          local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = false;
          aStack_180._8_8_ = 0;
          auStack_170[0] = false;
          auStack_170._1_3_ = 0;
          auStack_170._4_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_1a0._24_8_ = 0;
          aStack_180._M_allocated_capacity = 0;
          local_1a0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._16_8_ = (pointer)0x0;
          auStack_148[8] = false;
          auStack_170._32_8_ = (pointer)0x0;
          auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._24_8_ = (pointer)0x0;
          auStack_120[8] = 0;
          auStack_148._32_8_ = 0;
          auStack_120._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_148[0x10] = false;
          auStack_148._17_3_ = 0;
          auStack_148._20_4_ = (storage_t<unsigned_int>)0x0;
          auStack_148._24_8_ = 0;
          auStack_f8._32_8_ = auStack_f8 + 0x10;
          sStack_c0._24_1_ = false;
          sStack_c0._8_8_ = (pointer)0x0;
          sStack_c0._16_8_ = (storage_t<double>)0x0;
          auStack_f8._48_8_ = 0;
          sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = 0;
          local_a0._17_8_ = 0;
          local_a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[8] = 0;
          local_a0._9_7_ = 0;
          sStack_50._16_1_ = 0;
          sStack_50._17_8_ = 0;
          sStack_50.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          sStack_50._8_1_ = 0;
          sStack_50._9_7_ = 0;
          local_70._16_8_ = 0;
          local_70._24_8_ = 0;
          local_70._0_8_ = 0;
          local_70._8_8_ = 0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          auStack_f8._40_8_ = auStack_f8._32_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,*(long *)(local_5b8 + 1),
                     (long)&(local_5b8[1]._M_parent)->_M_color + *(long *)(local_5b8 + 1));
          local_4e8._0_4_ = SUB84(&local_4d8,0);
          uVar8 = local_4e8._0_4_;
          local_4e8._4_2_ = (undefined2)((ulong)&local_4d8 >> 0x20);
          uVar9 = local_4e8._4_2_;
          local_4e8._6_2_ = (undefined2)((ulong)&local_4d8 >> 0x30);
          uVar10 = local_4e8._6_2_;
          prop_00 = (Property *)local_4e8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","");
          args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_628,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_568,&local_2f0,prop,(string *)prop_00,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
          if (paVar4 != &local_4d8) {
            operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_628._0_4_ == TypeMismatch) {
            local_310._0_8_ = local_300;
            lVar26 = *(long *)(p_Var21 + 1);
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,lVar26,(long)&(p_Var21[1]._M_parent)->_M_color + lVar26);
            prop_00 = (Property *)local_4e8;
            local_4e8._0_4_ = uVar8;
            local_4e8._4_2_ = uVar9;
            local_4e8._6_2_ = uVar10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","")
            ;
            args = prop;
            args_2 = local_570;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_600,(_anonymous_namespace_ *)&local_568,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)prop,prop_00,(string *)local_570,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(bVar30,in_stack_fffffffffffff9c8));
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
            if (paVar4 != &local_4d8) {
              operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
            }
            if ((long *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_600._0_4_ == 0) {
              iVar13 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4e8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4e8,0x11eb);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_5b0._M_dataplus._M_p._0_7_ = SUB87(&local_5b0.field_2,0);
              local_5b0._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_5b0.field_2 >> 0x38);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5b0,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        (&local_5d8,(fmt *)&local_5b0,(string *)(local_600 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4e8,local_5d8._M_dataplus._M_p,
                                   local_5d8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                operator_delete(local_5d8._M_dataplus._M_p,
                                local_5d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT17(local_5b0._M_dataplus._M_p._7_1_,local_5b0._M_dataplus._M_p._0_7_) !=
                  &local_5b0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT17(local_5b0._M_dataplus._M_p._7_1_,
                                         local_5b0._M_dataplus._M_p._0_7_),
                                CONCAT17(local_5b0.field_2._M_local_buf[7],
                                         CONCAT25(local_5b0.field_2._M_allocated_capacity._5_2_,
                                                  local_5b0.field_2._M_allocated_capacity._0_5_)) +
                                1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar17 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_5b0,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar17 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar17 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_5d8.field_2._M_allocated_capacity = *psVar1;
                  local_5d8.field_2._8_8_ = plVar17[3];
                  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
                }
                else {
                  local_5d8.field_2._M_allocated_capacity = *psVar1;
                  local_5d8._M_dataplus._M_p = (pointer)*plVar17;
                }
                local_5d8._M_string_length = plVar17[1];
                *plVar17 = (long)psVar1;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_5d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                  operator_delete(local_5d8._M_dataplus._M_p,
                                  local_5d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_5b0._M_dataplus._M_p._7_1_,local_5b0._M_dataplus._M_p._0_7_)
                    != &local_5b0.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT17(local_5b0._M_dataplus._M_p._7_1_,
                                           local_5b0._M_dataplus._M_p._0_7_),
                                  CONCAT17(local_5b0.field_2._M_local_buf[7],
                                           CONCAT25(local_5b0.field_2._M_allocated_capacity._5_2_,
                                                    local_5b0.field_2._M_allocated_capacity._0_5_))
                                  + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
              ::std::ios_base::~ios_base(local_478);
              iVar13 = 1;
            }
            if ((undefined1 *)local_600._8_8_ != local_5f0 + 8) {
              operator_delete((void *)local_600._8_8_,local_5f0._8_8_ + 1);
            }
          }
          else {
            iVar13 = 0;
            if (local_628._0_4_ == Success) {
              bVar31 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,
                                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_570);
              iVar13 = 3;
              if (!bVar31) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4e8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4e8,0x11d9);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4e8,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar17 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_5d8,(ulong)(err->_M_dataplus)._M_p);
                  pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar17 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar17
                      == pbVar20) {
                    local_5f0._0_8_ = (pbVar20->_M_dataplus)._M_p;
                    local_5f0._8_8_ = plVar17[3];
                    local_600._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f0;
                  }
                  else {
                    local_5f0._0_8_ = (pbVar20->_M_dataplus)._M_p;
                    local_600._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar17;
                  }
                  local_600._8_8_ = plVar17[1];
                  *plVar17 = (long)pbVar20;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_600);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_600._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0
                     ) {
                    operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                    operator_delete(local_5d8._M_dataplus._M_p,
                                    local_5d8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
                ::std::ios_base::~ios_base(local_478);
                iVar13 = 1;
              }
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610) {
            operator_delete(local_620._M_p,(ulong)(auStack_610._0_8_ + 1));
          }
          if (local_a0[0x18] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar13 != 0) goto LAB_00256fea;
        }
        local_358._24_8_ = local_330;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_358 + 0x18),*(long *)(local_5b8 + 1),
                   (long)&(local_5b8[1]._M_parent)->_M_color + *(long *)(local_5b8 + 1));
        local_5b0._M_dataplus._M_p._0_7_ = SUB87(&local_5b0.field_2,0);
        local_5b0._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_5b0.field_2 >> 0x38);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"outputs:result","");
        uVar11 = local_338;
        lVar26 = (long)&local_4d8 + 8;
        local_4e0 = (undefined4)lVar26;
        acStack_4dc._0_2_ = (undefined2)((ulong)lVar26 >> 0x20);
        acStack_4dc._2_2_ = (undefined2)((ulong)lVar26 >> 0x30);
        local_4d8._M_allocated_capacity = 0;
        local_4d8._M_local_buf[8] = '\0';
        uVar23 = CONCAT17(local_5b0._M_string_length._7_1_,
                          CONCAT25(local_5b0._M_string_length._5_2_,
                                   (undefined5)local_5b0._M_string_length));
        __n_00 = local_338;
        if (uVar23 < local_338) {
          __n_00 = uVar23;
        }
        if (__n_00 == 0) {
          bVar31 = true;
        }
        else {
          iVar13 = bcmp((void *)local_358._24_8_,
                        (void *)CONCAT17(local_5b0._M_dataplus._M_p._7_1_,
                                         local_5b0._M_dataplus._M_p._0_7_),__n_00);
          bVar31 = iVar13 == 0;
        }
        if ((bool)(bVar31 ^ 1U | uVar11 != uVar23)) {
          local_4e8._0_4_ = 1;
        }
        else {
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_568,&local_5b0);
          p_Var21 = local_5b8;
          if ((_Rb_tree_header *)cVar18._M_node == &local_568._M_impl.super__Rb_tree_header) {
            if ((*(uint *)((long)&local_5b8[0x17]._M_parent + 4) < 2) &&
               (bVar31 = Attribute::is_connection((Attribute *)prop), bVar31)) {
              local_4e8._0_4_ = 5;
              prop_00 = (Property *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4e0,0,(char *)local_4d8._M_allocated_capacity,0x3fbaed);
            }
            else if (*(int *)((long)&p_Var21[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)prop);
              bVar31 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_628 = (undefined1  [8])local_618;
              local_618 = (undefined1  [8])0x6633746e696f70;
              local_620._M_p = (pointer)0x7;
              lVar26 = CONCAT26(sStack_2a4._2_2_,CONCAT24(sStack_2a4._0_2_,local_2b0._8_4_));
              if ((lVar26 == 7) &&
                 (*(int *)(local_2b0._0_8_ + 3) == 0x6633746e &&
                  *(int *)local_2b0._0_8_ == 0x6e696f70)) {
                (local_590->result)._authored = true;
LAB_002571cf:
                AttrMetas::operator=(local_578,(AttrMetas *)(p_Var21 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_568,&local_5b0);
                local_4e8._0_4_ = 0;
              }
              else {
                if (bVar31) {
                  local_4e8._0_4_ = 3;
                  local_600._0_8_ = local_5f0;
                  local_5d8._M_dataplus._M_p = (pointer)0x47;
                  pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create((ulong *)local_600,(ulong)&local_5d8);
                  __n_01 = 0x47;
                  pcVar14 = 
                  "Attribute type mismatch. {} expects type `{}` but defined as type `{}`.";
                }
                else {
                  local_628 = (undefined1  [8])local_618;
                  local_620._M_p = (pointer)0x6;
                  local_618 = (undefined1  [8])0x3374616f6c66;
                  if ((lVar26 == 6) &&
                     (*(short *)(local_2b0._0_8_ + 4) == 0x3374 &&
                      *(int *)local_2b0._0_8_ == 0x616f6c66)) {
                    (local_590->result)._authored = true;
                    ::std::__cxx11::string::_M_assign((string *)local_478._264_8_);
                    goto LAB_002571cf;
                  }
                  local_4e8._0_4_ = 3;
                  local_600._0_8_ = local_5f0;
                  local_5d8._M_dataplus._M_p = (pointer)0x61;
                  pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create((ulong *)local_600,(ulong)&local_5d8);
                  __n_01 = 0x61;
                  pcVar14 = 
                  "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                  ;
                }
                _Var5._M_p = local_5d8._M_dataplus._M_p;
                local_600._0_8_ = pbVar20;
                local_5f0._0_8_ = local_5d8._M_dataplus._M_p;
                memcpy(pbVar20,pcVar14,__n_01);
                local_600._8_8_ = _Var5._M_p;
                *((long)&(pbVar20->_M_dataplus)._M_p + _Var5._M_p) = '\0';
                local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
                local_5d8.field_2._M_allocated_capacity = 0x6633746e696f70;
                local_5d8._M_string_length = 7;
                prop_00 = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_628,(fmt *)local_600,&local_5b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           prop_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)args_2);
                ::std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_628);
                if (local_628 != (undefined1  [8])local_618) {
                  operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                  operator_delete(local_5d8._M_dataplus._M_p,
                                  local_5d8.field_2._M_allocated_capacity + 1);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_600._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0)
                {
                  operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT17(local_2a0._M_local_buf[7],
                                         CONCAT16(local_2a0._M_local_buf[6],
                                                  CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                           CONCAT13(local_2a0._M_local_buf[3],
                                                                    CONCAT12(local_2a0._M_local_buf
                                                                             [2],local_2a0.
                                                                                                                                                                  
                                                  _M_allocated_capacity._0_2_))))) + 1);
              }
            }
            else {
              prop_00 = (Property *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4e0,0,(char *)local_4d8._M_allocated_capacity,0x3fbb26);
              local_4e8._0_4_ = 6;
            }
          }
          else {
            local_4e8._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(local_5b0._M_dataplus._M_p._7_1_,local_5b0._M_dataplus._M_p._0_7_) !=
            &local_5b0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT17(local_5b0._M_dataplus._M_p._7_1_,local_5b0._M_dataplus._M_p._0_7_
                                  ),
                          CONCAT17(local_5b0.field_2._M_local_buf[7],
                                   CONCAT25(local_5b0.field_2._M_allocated_capacity._5_2_,
                                            local_5b0.field_2._M_allocated_capacity._0_5_)) + 1);
        }
        if ((undefined1 *)local_358._24_8_ != local_330) {
          operator_delete((void *)local_358._24_8_,local_330._0_8_ + 1);
        }
        iVar13 = 0;
        if ((local_4e8._0_4_ & 0xfffffffd) == 0) {
          iVar13 = 3;
LAB_00256b66:
          bVar31 = false;
        }
        else {
          bVar31 = true;
          if (local_4e8._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x11f1);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            local_600._0_8_ = local_5f0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_600,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_628,(fmt *)local_600,(string *)"outputs:result",
                       (char (*) [15])&local_4e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00)
            ;
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_628,(long)local_620._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            if (local_628 != (undefined1  [8])local_618) {
              operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
              operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar16 = (long *)::std::__cxx11::string::_M_append
                                          (local_600,(ulong)(err->_M_dataplus)._M_p);
              plVar17 = plVar16 + 2;
              if ((long *)*plVar16 == plVar17) {
                local_618 = (undefined1  [8])*plVar17;
                auStack_610._0_8_ = plVar16[3];
                local_628 = (undefined1  [8])local_618;
              }
              else {
                local_618 = (undefined1  [8])*plVar17;
                local_628 = (undefined1  [8])*plVar16;
              }
              local_620._M_p = (pointer)plVar16[1];
              *plVar16 = (long)plVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_628);
              if (local_628 != (undefined1  [8])local_618) {
                operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_600._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
                operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
            iVar13 = 1;
            goto LAB_00256b66;
          }
        }
        pcVar14 = (char *)CONCAT26(acStack_4dc._2_2_,CONCAT24(acStack_4dc._0_2_,local_4e0));
        if (pcVar14 != local_4d8._M_local_buf + 8) {
          operator_delete(pcVar14,CONCAT71(local_4d8._9_7_,local_4d8._M_local_buf[8]) + 1);
        }
        p_Var21 = local_588;
        if (bVar31) {
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_568,(key_type *)local_588);
          p_Var2 = &local_568._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar18._M_node == p_Var2) {
            pmVar19 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_360,(key_type *)p_Var21);
            ::std::__cxx11::string::_M_assign((string *)pmVar19);
            p_Var28 = local_5b8;
            (pmVar19->_attrib)._varying_authored = (bool)local_5b8[3].field_0x4;
            (pmVar19->_attrib)._variability = local_5b8[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar19->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar19->_attrib)._var,(any *)&p_Var28[4]._M_parent);
            (pmVar19->_attrib)._var._blocked = SUB41(p_Var28[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar19->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var28[5]._M_parent);
            (pmVar19->_attrib)._var._ts._dirty = SUB41(p_Var28[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar19->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var28[6]._M_parent);
            AttrMetas::operator=(&(pmVar19->_attrib)._metas,(AttrMetas *)(p_Var28 + 7));
            *(_Base_ptr *)&pmVar19->_listOpQual = p_Var28[0x17]._M_parent;
            (pmVar19->_rel).type = *(Type *)&p_Var28[0x17]._M_left;
            Path::operator=(&(pmVar19->_rel).targetPath,(Path *)&p_Var28[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar19->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var28[0x1e]._M_parent);
            (pmVar19->_rel).listOpQual = p_Var28[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar19->_rel)._metas,(AttrMetas *)&p_Var28[0x1f]._M_parent);
            (pmVar19->_rel)._varying_authored = *(bool *)&p_Var28[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar19->_prop_value_type_name);
            p_Var21 = local_588;
            pmVar19->_has_custom = *(bool *)&p_Var28[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_568,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_588);
          }
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_568,(key_type *)p_Var21);
          iVar13 = 0;
          if ((_Rb_tree_header *)cVar18._M_node == p_Var2) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x11f3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4e8,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var21);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,
                                 (char *)CONCAT26(local_4e8._6_2_,
                                                  CONCAT24(local_4e8._4_2_,local_4e8._0_4_)),
                                 CONCAT26(acStack_4dc._2_2_,CONCAT24(acStack_4dc._0_2_,local_4e0)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
            if (paVar4 != &local_4d8) {
              operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
            }
            uVar27 = local_358._0_8_;
            if ((anon_struct_8_0_00000001_for___align)local_358._0_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar16 = (long *)::std::__cxx11::string::_M_append
                                          (local_628,(ulong)(err->_M_dataplus)._M_p);
              local_4e8._0_4_ = SUB84(&local_4d8,0);
              local_4e8._4_2_ = (undefined2)((ulong)&local_4d8 >> 0x20);
              local_4e8._6_2_ = (undefined2)((ulong)&local_4d8 >> 0x30);
              lVar26 = *plVar16;
              plVar17 = plVar16 + 2;
              if ((long *)lVar26 == plVar17) {
                local_4d8._M_allocated_capacity = *plVar17;
                local_4d8._M_local_buf[8] = (char)plVar16[3];
                local_4d8._9_7_ = (undefined7)((ulong)plVar16[3] >> 8);
              }
              else {
                local_4e8._0_4_ = (undefined4)lVar26;
                local_4e8._4_2_ = (undefined2)((ulong)lVar26 >> 0x20);
                local_4e8._6_2_ = (undefined2)((ulong)lVar26 >> 0x30);
                local_4d8._M_allocated_capacity = *plVar17;
              }
              lVar26 = plVar16[1];
              local_4e0 = (undefined4)lVar26;
              acStack_4dc._0_2_ = (undefined2)((ulong)lVar26 >> 0x20);
              acStack_4dc._2_2_ = (undefined2)((ulong)lVar26 >> 0x30);
              *plVar16 = (long)plVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar27,(string *)local_4e8);
              paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT26(local_4e8._6_2_,CONCAT24(local_4e8._4_2_,local_4e8._0_4_));
              if (paVar4 != &local_4d8) {
                operator_delete(paVar4,(ulong)(local_4d8._M_allocated_capacity + 1));
              }
              if (local_628 != (undefined1  [8])local_618) {
                operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          }
        }
      }
LAB_00256fea:
      if ((iVar13 != 3) && (iVar13 != 0)) break;
      local_5b8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_5b8);
      bVar30 = local_5b8 == (_Base_ptr)local_358._16_8_;
    } while (!(bool)bVar30);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_568,(_Link_type)local_568._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(bVar30 & 1);
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_point>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_point *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_point,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_point, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_point, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}